

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

bool_t wwIsW_fast(word *a,size_t n,word w)

{
  word *pwVar1;
  long lVar2;
  
  if (n == 0) {
    return (bool_t)(w == 0);
  }
  if (*a == w) {
    lVar2 = n - 1;
    do {
      if (lVar2 == 0) {
        return 1;
      }
      pwVar1 = a + lVar2;
      lVar2 = lVar2 + -1;
    } while (*pwVar1 == 0);
  }
  return 0;
}

Assistant:

bool_t FAST(wwIsW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = (w == 0);
	else
	{
		ret = (a[0] == w);
		while (ret && --n)
			ret = (a[n] == 0);
	}
	w = 0;
	return ret;
}